

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMatrixX.h
# Opt level: O3

void __thiscall btVectorX<float>::resize(btVectorX<float> *this,int rows)

{
  float *ptr;
  uint uVar1;
  float *pfVar2;
  ulong uVar3;
  long lVar4;
  
  uVar1 = (this->m_storage).m_size;
  if (rows <= (int)uVar1) goto LAB_001d069d;
  lVar4 = (long)(int)uVar1;
  if ((this->m_storage).m_capacity < rows) {
    if (rows == 0) {
      pfVar2 = (float *)0x0;
    }
    else {
      pfVar2 = (float *)btAlignedAllocInternal((long)rows * 4,0x10);
      uVar1 = (this->m_storage).m_size;
    }
    ptr = (this->m_storage).m_data;
    if ((int)uVar1 < 1) {
      if (ptr != (float *)0x0) goto LAB_001d066f;
    }
    else {
      uVar3 = 0;
      do {
        pfVar2[uVar3] = ptr[uVar3];
        uVar3 = uVar3 + 1;
      } while (uVar1 != uVar3);
LAB_001d066f:
      if ((this->m_storage).m_ownsMemory == true) {
        btAlignedFreeInternal(ptr);
      }
    }
    (this->m_storage).m_ownsMemory = true;
    (this->m_storage).m_data = pfVar2;
    (this->m_storage).m_capacity = rows;
  }
  else {
    pfVar2 = (this->m_storage).m_data;
  }
  memset(pfVar2 + lVar4,0,(rows - lVar4) * 4);
LAB_001d069d:
  (this->m_storage).m_size = rows;
  return;
}

Assistant:

void resize(int rows)
	{
		m_storage.resize(rows);
	}